

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.c
# Opt level: O1

void * util_map_tmpfile(char *dir,size_t size,size_t req_align)

{
  int __fd;
  int iVar1;
  int *piVar2;
  void *pvVar3;
  undefined1 local_2c [2];
  byte local_2a;
  
  if ((long)size < 0) {
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/mmap.c",0x77,
            "util_map_tmpfile","invalid size (%zu) for os_off_t",size);
    piVar2 = __errno_location();
    *piVar2 = 0x1b;
  }
  else {
    __fd = util_tmpfile(dir,"/vmem.XXXXXX",0x80);
    if (__fd != -1) {
      iVar1 = ioctl(__fd,0x80086601,local_2c);
      if (-1 < iVar1) {
        local_2a = local_2a | 0x80;
        ioctl(__fd,0x40086602);
      }
      iVar1 = os_posix_fallocate(__fd,0,size);
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      if (iVar1 == 0) {
        pvVar3 = util_map(__fd,size,1,0,req_align,(int *)0x0);
        if (pvVar3 != (void *)0x0) {
          close(__fd);
          return pvVar3;
        }
      }
      else {
        out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/mmap.c",0x85
                ,"util_map_tmpfile","!posix_fallocate");
      }
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (__fd != -1) {
      close(__fd);
    }
    *piVar2 = iVar1;
  }
  return (void *)0x0;
}

Assistant:

void *
util_map_tmpfile(const char *dir, size_t size, size_t req_align)
{
	int oerrno;

	if (((os_off_t)size) < 0) {
		ERR("invalid size (%zu) for os_off_t", size);
		errno = EFBIG;
		return NULL;
	}

	int fd = util_tmpfile(dir, OS_DIR_SEP_STR "vmem.XXXXXX", O_EXCL);
	if (fd == -1) {
		LOG(2, "cannot create temporary file in dir %s", dir);
		goto err;
	}

	chattr(fd, FS_NOCOW_FL, 0);

	if ((errno = os_posix_fallocate(fd, 0, (os_off_t)size)) != 0) {
		ERR("!posix_fallocate");
		goto err;
	}

	void *base;
	if ((base = util_map(fd, size, MAP_SHARED,
			0, req_align, NULL)) == NULL) {
		LOG(2, "cannot mmap temporary file");
		goto err;
	}

	(void) os_close(fd);
	return base;

err:
	oerrno = errno;
	if (fd != -1)
		(void) os_close(fd);
	errno = oerrno;
	return NULL;
}